

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O3

void testing::internal::ContainerPrinter::
     PrintValue<std::vector<bssl::der::Input,std::allocator<bssl::der::Input>>,void>
               (vector<bssl::der::Input,_std::allocator<bssl::der::Input>_> *container,ostream *os)

{
  pointer pIVar1;
  ostream *in_RCX;
  long lVar2;
  pointer pIVar3;
  Input data;
  char local_35;
  char local_34;
  char local_33;
  char local_32;
  char local_31;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,&local_33,1);
  pIVar3 = (container->super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pIVar1 = (container->super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (pIVar3 != pIVar1) {
    lVar2 = 0;
    do {
      if ((lVar2 != 0) &&
         (std::__ostream_insert<char,std::char_traits<char>>(os,&local_35,1), lVar2 == 0x20)) {
        std::__ostream_insert<char,std::char_traits<char>>(os," ...",4);
        goto LAB_00211a73;
      }
      std::__ostream_insert<char,std::char_traits<char>>(os,&local_34,1);
      data.data_.size_ = (size_t)os;
      data.data_.data_ = (uchar *)(pIVar3->data_).size_;
      bssl::der::PrintTo((der *)(pIVar3->data_).data_,data,in_RCX);
      lVar2 = lVar2 + 1;
      pIVar3 = pIVar3 + 1;
    } while (pIVar3 != pIVar1);
    if (lVar2 != 0) {
LAB_00211a73:
      std::__ostream_insert<char,std::char_traits<char>>(os,&local_32,1);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,&local_31,1);
  return;
}

Assistant:

static void PrintValue(const T& container, std::ostream* os) {
    const size_t kMaxCount = 32;  // The maximum number of elements to print.
    *os << '{';
    size_t count = 0;
    for (auto&& elem : container) {
      if (count > 0) {
        *os << ',';
        if (count == kMaxCount) {  // Enough has been printed.
          *os << " ...";
          break;
        }
      }
      *os << ' ';
      // We cannot call PrintTo(elem, os) here as PrintTo() doesn't
      // handle `elem` being a native array.
      internal::UniversalPrint(elem, os);
      ++count;
    }

    if (count > 0) {
      *os << ' ';
    }
    *os << '}';
  }